

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageFieldNoLabel
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  Tokenizer *pTVar4;
  pointer pcVar5;
  ulong uVar6;
  void *pvVar7;
  undefined4 uVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  string *psVar12;
  long *plVar13;
  Arena *pAVar14;
  ArenaStringPtr *pAVar15;
  long lVar16;
  RepeatedField<int> *this_00;
  ulong uVar17;
  string_view text;
  ErrorMaker error;
  ErrorMaker error_00;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  Type type;
  Token name_token;
  MapField map_field;
  undefined1 local_100 [56];
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  undefined1 local_b0 [32];
  ColumnNumber local_90;
  pointer local_88;
  MapField local_80;
  
  paVar2 = &local_80.key_type_name.field_2;
  local_80.is_map_field = false;
  local_80.key_type_name._M_string_length = 0;
  local_80.key_type_name.field_2._M_local_buf[0] = '\0';
  local_80.value_type_name._M_dataplus._M_p = (pointer)&local_80.value_type_name.field_2;
  local_80.value_type_name._M_string_length = 0;
  local_80.value_type_name.field_2._M_local_buf[0] = '\0';
  local_c8 = (undefined1  [8])messages;
  local_80.key_type_name._M_dataplus._M_p = (pointer)paVar2;
  LocationRecorder::LocationRecorder((LocationRecorder *)local_100,field_location);
  local_100._24_4_ = location_field_number_for_nested_type;
  local_88 = (pointer)parent_location;
  LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_100,&field->super_Message,TYPE);
  local_100._32_4_ = 5;
  local_b8._M_p = (char *)0x0;
  local_b0[0] = '\0';
  text._M_str = "map";
  text._M_len = 3;
  local_c0 = (undefined1  [8])local_b0;
  bVar9 = TryConsume(this,text);
  if (bVar9) {
    if (((this->input_->current_).text._M_string_length != 1) ||
       (*(this->input_->current_).text._M_dataplus._M_p != '<')) {
      bVar9 = true;
      std::__cxx11::string::_M_replace((ulong)local_c0,0,local_b8._M_p,0x3359ed);
      goto LAB_001d247d;
    }
    local_80.is_map_field = true;
    bVar9 = ParseMapType(this,&local_80,field,(LocationRecorder *)local_100);
    if (bVar9) goto LAB_001d245a;
LAB_001d255b:
    if (local_c0 != (undefined1  [8])local_b0) {
      operator_delete((void *)local_c0,CONCAT71(local_b0._1_7_,local_b0[0]) + 1);
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
    bVar9 = false;
    goto LAB_001d2a0b;
  }
LAB_001d245a:
  bVar9 = false;
LAB_001d247d:
  if (local_80.is_map_field == false) {
    uVar11 = *(uint *)&field->field_0;
    if ((uVar11 >> 9 & 1) == 0) {
      bVar10 = DefaultToOptionalFields(this);
      if (bVar10) {
        bVar10 = FieldDescriptorProto_Label_IsValid(1);
        if (!bVar10) goto LAB_001d2a91;
        (field->field_0)._impl_.label_ = 1;
        uVar11 = (field->field_0)._impl_._has_bits_.has_bits_[0] | 0x200;
        *(uint *)&field->field_0 = uVar11;
      }
      else {
        uVar11 = (field->field_0)._impl_._has_bits_.has_bits_[0];
      }
    }
    if ((uVar11 >> 9 & 1) == 0) {
      RecordError(this,(ErrorMaker)ZEXT816(0x3359f3));
      bVar10 = FieldDescriptorProto_Label_IsValid(1);
      if (!bVar10) {
LAB_001d2a91:
        __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
                      ,0x37b2,
                      "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                     );
      }
      (field->field_0)._impl_.label_ = 1;
      pbVar1 = (byte *)((long)&field->field_0 + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    if ((!bVar9) && (bVar9 = ParseType(this,(Type *)(local_100 + 0x20),(string *)local_c0), !bVar9))
    goto LAB_001d255b;
    this_00 = &(((anon_union_96_1_493b367e_for_SourceCodeInfo_Location_4 *)(local_100._16_8_ + 0x10)
                )->_impl_).path_;
    if (local_b8._M_p == (char *)0x0) {
      RepeatedField<int>::Add(this_00,5);
      uVar8 = local_100._32_4_;
      bVar9 = FieldDescriptorProto_Type_IsValid(local_100._32_4_);
      if (!bVar9) {
        __assert_fail("::google::protobuf::FieldDescriptorProto_Type_IsValid(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
                      ,0x37cf,
                      "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                     );
      }
      (field->field_0)._impl_.type_ = uVar8;
      pbVar1 = (byte *)((long)&field->field_0 + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    else {
      RepeatedField<int>::Add(this_00,6);
      *(byte *)&field->field_0 = *(byte *)&field->field_0 | 4;
      pAVar14 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar14 & 1) != 0) {
        pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(field->field_0)._impl_.type_name_,(string *)local_c0,pAVar14);
    }
  }
  if (local_c0 != (undefined1  [8])local_b0) {
    operator_delete((void *)local_c0,CONCAT71(local_b0._1_7_,local_b0[0]) + 1);
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
  pTVar4 = this->input_;
  local_c0._0_4_ = (pTVar4->current_).type;
  local_b8._M_p = local_b0 + 8;
  pcVar5 = (pTVar4->current_).text._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar5,pcVar5 + (pTVar4->current_).text._M_string_length);
  local_90 = (pTVar4->current_).end_column;
  local_b0._24_4_ = (pTVar4->current_).line;
  local_b0._28_4_ = (pTVar4->current_).column;
  LocationRecorder::LocationRecorder((LocationRecorder *)local_100,field_location,1);
  LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_100,&field->super_Message,NAME);
  *(byte *)&field->field_0 = *(byte *)&field->field_0 | 1;
  pAVar14 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar14 & 1) != 0) {
    pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
  }
  pAVar15 = &(field->field_0)._impl_.name_;
  psVar12 = internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar15,pAVar14);
  bVar9 = ConsumeIdentifier(this,psVar12,(ErrorMaker)ZEXT816(0x335a23));
  if (bVar9) {
    plVar13 = (long *)((ulong)(pAVar15->tagged_ptr_).ptr_ & 0xfffffffffffffffc);
    if (plVar13[1] != 0) {
      lVar16 = 0;
      do {
        cVar3 = *(char *)(*plVar13 + lVar16);
        if (((9 < (byte)(cVar3 - 0x30U)) && (cVar3 != '_')) && (0x19 < (byte)(cVar3 + 0x9fU))) {
          error.func_ = ErrorMaker::
                        ErrorMaker<google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_0,void>(google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_0)
                        ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
          error.field_0.error_ = (char *)field;
          RecordWarning(this,error);
          plVar13 = (long *)((ulong)(pAVar15->tagged_ptr_).ptr_ & 0xfffffffffffffffc);
          break;
        }
        lVar16 = lVar16 + 1;
      } while (plVar13[1] != lVar16);
    }
    uVar6 = plVar13[1];
    if (1 < uVar6) {
      bVar9 = true;
      uVar17 = 2;
      do {
        if (((byte)(*(char *)(*plVar13 + -1 + uVar17) - 0x30U) < 10) &&
           (*(char *)(*plVar13 + -2 + uVar17) == '_')) break;
        bVar9 = uVar17 < uVar6;
        bVar10 = uVar17 != uVar6;
        uVar17 = uVar17 + 1;
      } while (bVar10);
      if (bVar9) {
        error_00.func_ =
             ErrorMaker::
             ErrorMaker<google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_1,void>(google::protobuf::compiler::Parser::ParseMessageFieldNoLabel(google::protobuf::FieldDescriptorProto*,google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>*,google::protobuf::compiler::Parser::LocationRecorder_const&,int,google::protobuf::compiler::Parser::LocationRecorder_const&,google::protobuf::FileDescriptorProto_const*)::$_1)
             ::{lambda(void_const*)#1}::__invoke_abi_cxx11_;
        error_00.field_0.error_ = (char *)field;
        RecordWarning(this,error_00);
      }
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
    text_00._M_str = "=";
    text_00._M_len = 1;
    bVar9 = TryConsume(this,text_00);
    if (bVar9) {
      LocationRecorder::LocationRecorder((LocationRecorder *)local_100,field_location,3);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)local_100,&field->super_Message,NUMBER);
      bVar9 = ConsumeInteger(this,(int *)(local_100 + 0x20),(ErrorMaker)ZEXT816(0x335a4e));
      if (!bVar9) goto LAB_001d29e8;
      (field->field_0)._impl_.number_ = local_100._32_4_;
      *(byte *)&field->field_0 = *(byte *)&field->field_0 | 0x40;
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
      bVar9 = ParseFieldOptions(this,field,field_location,containing_file);
      if (bVar9) {
        if (((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x400) ==
             (undefined1  [80])0x0) || ((field->field_0)._impl_.type_ != 10)) {
          text_02._M_str = ";";
          text_02._M_len = 1;
          bVar9 = ConsumeEndOfDeclaration(this,text_02,field_location);
          if (bVar9) {
LAB_001d29b4:
            bVar9 = true;
            if (local_80.is_map_field == true) {
              GenerateMapEntry(this,&local_80,field,
                               (RepeatedPtrField<google::protobuf::DescriptorProto> *)local_c8);
            }
            goto LAB_001d29f4;
          }
        }
        else {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_100,(LocationRecorder *)local_88);
          LocationRecorder::StartAt((LocationRecorder *)local_100,field_location);
          RepeatedField<int>::Add
                    (&(((anon_union_96_1_493b367e_for_SourceCodeInfo_Location_4 *)
                       (local_100._16_8_ + 0x10))->_impl_).path_,local_100._24_4_);
          RepeatedField<int>::Add
                    (&(((anon_union_96_1_493b367e_for_SourceCodeInfo_Location_4 *)
                       (local_100._16_8_ + 0x10))->_impl_).path_,*(int *)((long)local_c8 + 8));
          local_100._24_8_ =
               internal::RepeatedPtrFieldBase::AddMessageLite
                         ((RepeatedPtrFieldBase *)local_c8,
                          Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
          pvVar7 = (pAVar15->tagged_ptr_).ptr_;
          (((DescriptorProto *)local_100._24_8_)->field_0)._impl_._has_bits_.has_bits_[0] =
               (((DescriptorProto *)local_100._24_8_)->field_0)._impl_._has_bits_.has_bits_[0] | 1;
          pAVar15 = &(((DescriptorProto *)local_100._24_8_)->field_0)._impl_.name_;
          pAVar14 = (Arena *)(((DescriptorProto *)local_100._24_8_)->super_Message).
                             super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar14 & 1) != 0) {
            pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>
                    (pAVar15,(string *)((ulong)pvVar7 & 0xfffffffffffffffc),pAVar14);
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)(local_100 + 0x20),(LocationRecorder *)local_100,1);
          LocationRecorder::StartAt((LocationRecorder *)(local_100 + 0x20),(Token *)local_c0);
          LocationRecorder::EndAt((LocationRecorder *)(local_100 + 0x20),(Token *)local_c0);
          LocationRecorder::RecordLegacyLocation
                    ((LocationRecorder *)(local_100 + 0x20),(Message *)local_100._24_8_,NAME);
          LocationRecorder::~LocationRecorder((LocationRecorder *)(local_100 + 0x20));
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)(local_100 + 0x20),field_location,6);
          LocationRecorder::StartAt((LocationRecorder *)(local_100 + 0x20),(Token *)local_c0);
          LocationRecorder::EndAt((LocationRecorder *)(local_100 + 0x20),(Token *)local_c0);
          LocationRecorder::~LocationRecorder((LocationRecorder *)(local_100 + 0x20));
          if ((byte)(**(char **)((ulong)(pAVar15->tagged_ptr_).ptr_ & 0xfffffffffffffffc) + 0xa5U) <
              0xe6) {
            RecordError(this,local_b0._24_4_,local_b0._28_4_,(ErrorMaker)ZEXT816(0x335a65));
          }
          psVar12 = FieldDescriptorProto::mutable_name_abi_cxx11_(field);
          absl::lts_20240722::AsciiStrToLower((string *)psVar12);
          pvVar7 = (pAVar15->tagged_ptr_).ptr_;
          (field->field_0)._impl_._has_bits_.has_bits_[0] =
               (field->field_0)._impl_._has_bits_.has_bits_[0] | 4;
          pAVar14 = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar14 & 1) != 0) {
            pAVar14 = *(Arena **)((ulong)pAVar14 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>
                    (&(field->field_0)._impl_.type_name_,
                     (string *)((ulong)pvVar7 & 0xfffffffffffffffc),pAVar14);
          text_01._M_str = "{";
          text_01._M_len = 1;
          bVar9 = LookingAt(this,text_01);
          if (!bVar9) {
            RecordError(this,(ErrorMaker)ZEXT816(0x335a93));
            goto LAB_001d29e8;
          }
          bVar9 = ParseMessageBlock(this,(DescriptorProto *)local_100._24_8_,
                                    (LocationRecorder *)local_100,containing_file);
          this = (Parser *)local_100;
          LocationRecorder::~LocationRecorder((LocationRecorder *)this);
          if (bVar9) goto LAB_001d29b4;
        }
      }
      goto LAB_001d29f2;
    }
    bVar9 = false;
    RecordError(this,(ErrorMaker)ZEXT816(0x335a38));
  }
  else {
LAB_001d29e8:
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
LAB_001d29f2:
    bVar9 = false;
  }
LAB_001d29f4:
  if (local_b8._M_p != local_b0 + 8) {
    operator_delete(local_b8._M_p,local_b0._8_8_ + 1);
  }
LAB_001d2a0b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.value_type_name._M_dataplus._M_p != &local_80.value_type_name.field_2) {
    operator_delete(local_80.value_type_name._M_dataplus._M_p,
                    CONCAT71(local_80.value_type_name.field_2._M_allocated_capacity._1_7_,
                             local_80.value_type_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.key_type_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.key_type_name._M_dataplus._M_p,
                    CONCAT71(local_80.key_type_name.field_2._M_allocated_capacity._1_7_,
                             local_80.key_type_name.field_2._M_local_buf[0]) + 1);
  }
  return bVar9;
}

Assistant:

bool Parser::ParseMessageFieldNoLabel(
    FieldDescriptorProto* field, RepeatedPtrField<DescriptorProto>* messages,
    const LocationRecorder& parent_location,
    int location_field_number_for_nested_type,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  MapField map_field;
  // Parse type.
  {
    LocationRecorder location(field_location);  // add path later
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::TYPE);

    bool type_parsed = false;
    FieldDescriptorProto::Type type = FieldDescriptorProto::TYPE_INT32;
    std::string type_name;

    // Special case map field. We only treat the field as a map field if the
    // field type name starts with the word "map" with a following "<".
    if (TryConsume("map")) {
      if (LookingAt("<")) {
        map_field.is_map_field = true;
        DO(ParseMapType(&map_field, field, location));
      } else {
        // False positive
        type_parsed = true;
        type_name = "map";
      }
    }
    if (!map_field.is_map_field) {
      // Handle the case where no explicit label is given for a non-map field.
      if (!field->has_label() && DefaultToOptionalFields()) {
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }
      if (!field->has_label()) {
        RecordError("Expected \"required\", \"optional\", or \"repeated\".");
        // We can actually reasonably recover here by just assuming the user
        // forgot the label altogether.
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }

      // Handle the case where the actual type is a message or enum named
      // "map", which we already consumed in the code above.
      if (!type_parsed) {
        DO(ParseType(&type, &type_name));
      }
      if (type_name.empty()) {
        location.AddPath(FieldDescriptorProto::kTypeFieldNumber);
        field->set_type(type);
      } else {
        location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
        field->set_type_name(type_name);
      }
    }
  }

  // Parse name and '='.
  io::Tokenizer::Token name_token = input_->current();
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(field->mutable_name(), "Expected field name."));

    if (!IsLowerUnderscore(field->name())) {
      RecordWarning([=] {
        return absl::StrCat(
            "Field name should be lowercase. Found: ", field->name(),
            ". See: https://developers.google.com/protocol-buffers/docs/style");
      });
    }
    if (IsNumberFollowUnderscore(field->name())) {
      RecordWarning([=] {
        return absl::StrCat(
            "Number should not come right after an underscore. Found: ",
            field->name(),
            ". See: https://developers.google.com/protocol-buffers/docs/style");
      });
    }
  }
  DO(Consume("=", "Missing field number."));

  // Parse field number.
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(field,
                                  DescriptorPool::ErrorCollector::NUMBER);
    int number;
    DO(ConsumeInteger(&number, "Expected field number."));
    field->set_number(number);
  }

  // Parse options.
  DO(ParseFieldOptions(field, field_location, containing_file));

  // Deal with groups.
  if (field->has_type() && field->type() == FieldDescriptorProto::TYPE_GROUP) {
    // Awkward:  Since a group declares both a message type and a field, we
    //   have to create overlapping locations.
    LocationRecorder group_location(parent_location);
    group_location.StartAt(field_location);
    group_location.AddPath(location_field_number_for_nested_type);
    group_location.AddPath(messages->size());

    DescriptorProto* group = messages->Add();
    group->set_name(field->name());

    // Record name location to match the field name's location.
    {
      LocationRecorder location(group_location,
                                DescriptorProto::kNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
      location.RecordLegacyLocation(group,
                                    DescriptorPool::ErrorCollector::NAME);
    }

    // The field's type_name also comes from the name.  Confusing!
    {
      LocationRecorder location(field_location,
                                FieldDescriptorProto::kTypeNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
    }

    // As a hack for backwards-compatibility, we force the group name to start
    // with a capital letter and lower-case the field name.  New code should
    // not use groups; it should use nested messages.
    if (group->name()[0] < 'A' || 'Z' < group->name()[0]) {
      RecordError(name_token.line, name_token.column,
                  "Group names must start with a capital letter.");
    }
    absl::AsciiStrToLower(field->mutable_name());

    field->set_type_name(group->name());
    if (LookingAt("{")) {
      DO(ParseMessageBlock(group, group_location, containing_file));
    } else {
      RecordError("Missing group body.");
      return false;
    }
  } else {
    DO(ConsumeEndOfDeclaration(";", &field_location));
  }

  // Create a map entry type if this is a map field.
  if (map_field.is_map_field) {
    GenerateMapEntry(map_field, field, messages);
  }

  return true;
}